

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O2

uint32 __thiscall
Clasp::mt::SharedLitsClause::isOpen(SharedLitsClause *this,Solver *s,TypeSet *x,LitVec *freeLits)

{
  uint uVar1;
  SharedLiterals *pSVar2;
  bool bVar3;
  byte bVar4;
  uint32 uVar5;
  ulong uVar6;
  SharedLiterals *x_00;
  
  uVar5 = 0;
  if (((x->m >> ((this->super_ClauseHead).info_.super_ConstraintScore.rep >> 0x1c & 3) & 1) != 0) &&
     (bVar3 = ClauseHead::satisfied(&this->super_ClauseHead,s), uVar5 = 0, !bVar3)) {
    pSVar2 = (this->super_ClauseHead).field_0.shared_;
    x_00 = pSVar2 + 1;
    for (uVar6 = (ulong)(pSVar2->size_type_ & 0xfffffffc); uVar6 != 0; uVar6 = uVar6 - 4) {
      uVar1 = (x_00->refCount_).super___atomic_base<int>._M_i;
      bVar4 = *(byte *)((long)(s->assign_).assign_.ebo_.buf + (ulong)(uVar1 & 0xfffffffc)) & 3;
      if (bVar4 == 0) {
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                  (freeLits,(Literal *)x_00);
      }
      else if (bVar4 == (byte)(2U - ((uVar1 & 2) == 0))) {
        (this->super_ClauseHead).head_[2].rep_ = uVar1;
        return 0;
      }
      x_00 = (SharedLiterals *)&x_00->size_type_;
    }
    uVar5 = (this->super_ClauseHead).info_.super_ConstraintScore.rep >> 0x1c & 3;
  }
  return uVar5;
}

Assistant:

uint32 SharedLitsClause::isOpen(const Solver& s, const TypeSet& x, LitVec& freeLits) {
	if (!x.inSet(ClauseHead::type()) || ClauseHead::satisfied(s)) {
		return 0;
	}
	Literal* head = head_;
	ValueRep v;
	for (const Literal* r = shared_->begin(), *end = shared_->end(); r != end; ++r) {
		if ( (v = s.value(r->var())) == value_free ) {
			freeLits.push_back(*r);
		}
		else if (v == trueValue(*r)) {
			head[2] = *r; // remember as cache literal
			return 0;
		}
	}
	return ClauseHead::type();
}